

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void es::init::report_singletons_stack(void)

{
  ostream *poVar1;
  ostream *unaff_retaddr;
  singletons_meta_data *p;
  uint64_t n;
  singletons_meta_data *local_10;
  singletons_meta_data *md;
  
  md = (singletons_meta_data *)0x0;
  for (local_10 = static_obj_stack<es::init::singletons_meta_data>::top._u._s._p;
      local_10 != (singletons_meta_data *)0x0; local_10 = local_10->_next) {
    poVar1 = std::operator<<((ostream *)&std::cout,"singletons_stack_meta_data_node[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)md);
    std::operator<<(poVar1,"]: ");
    poVar1 = operator<<(unaff_retaddr,md);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    md = (singletons_meta_data *)((long)&md->_next + 1);
  }
  return;
}

Assistant:

inline void report_singletons_stack()
{
    uint64_t n{0};
    for (singletons_meta_data* p = stack::top._u._s._p; p != nullptr; p = p->_next)
    {
        std::cout << "singletons_stack_meta_data_node[" << n << "]: " << *p << std::endl;
        ++n;
    }
}